

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
reserve(vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
        *this,size_t n)

{
  memory_resource *pmVar1;
  Bin *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  Bin *pBVar4;
  
  if (this->nAlloc < n) {
    if (n * 0xc == 0) {
      pBVar4 = (Bin *)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0xc,4);
      pBVar4 = (Bin *)CONCAT44(extraout_var,iVar3);
    }
    if (this->nStored != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pBVar2 = this->ptr;
        *(undefined4 *)((long)&pBVar4->alias + lVar5) =
             *(undefined4 *)((long)&pBVar2->alias + lVar5);
        *(undefined8 *)((long)&pBVar4->q + lVar5) = *(undefined8 *)((long)&pBVar2->q + lVar5);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0xc;
      } while (uVar6 < this->nStored);
    }
    if (this->ptr != (Bin *)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0xc,4);
    }
    this->nAlloc = n;
    this->ptr = pBVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }